

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O0

void __thiscall VCFilter::addFiles(VCFilter *this,ProStringList *fileList)

{
  long lVar1;
  ProString *this_00;
  qsizetype qVar2;
  QList<ProString> *in_RSI;
  QList<ProString> *in_RDI;
  long in_FS_OFFSET;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = 0;
  while( true ) {
    this_00 = (ProString *)(long)iVar3;
    qVar2 = QList<ProString>::size(in_RSI);
    if (qVar2 <= (long)this_00) break;
    QList<ProString>::at(in_RDI,(qsizetype)this_00);
    ProString::toQString(this_00);
    addFile((VCFilter *)CONCAT44(iVar3,in_stack_ffffffffffffffc8),(QString *)in_RDI);
    QString::~QString((QString *)0x272846);
    iVar3 = iVar3 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VCFilter::addFiles(const ProStringList& fileList)
{
    for (int i = 0; i < fileList.size(); ++i)
        addFile(fileList.at(i).toQString());
}